

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalClose(Wal *pWal,sqlite3 *db,int sync_flags,int nBuf,u8 *zBuf)

{
  long lVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Wal *in_RSI;
  long in_RDI;
  sqlite3_vfs *in_R8;
  long in_FS_OFFSET;
  int unaff_retaddr;
  u8 *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int isDelete;
  int rc;
  int bPersist;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  sqlite3_vfs *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar2;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (in_RDI != 0) {
    uVar2 = 0;
    if ((in_R8 != (sqlite3_vfs *)0x0) &&
       (iVar3 = sqlite3OsLock((sqlite3_file *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c),
       iVar3 == 0)) {
      if (*(char *)(in_RDI + 0x3f) == '\0') {
        *(undefined1 *)(in_RDI + 0x3f) = 1;
      }
      iVar3 = sqlite3WalCheckpoint
                        (in_RSI,(sqlite3 *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                         (_func_int_void_ptr *)(ulong)uVar2,
                         (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc,unaff_retaddr,in_stack_00000008,in_stack_00000010
                         ,in_stack_00000018);
      in_stack_ffffffffffffff98 = in_ECX;
      in_stack_ffffffffffffffa0 = in_R8;
      if (iVar3 == 0) {
        sqlite3OsFileControlHint((sqlite3_file *)in_R8,in_stack_ffffffffffffff9c,(void *)0x1673f9);
        uVar2 = 1;
        in_stack_ffffffffffffff98 = in_ECX;
        in_stack_ffffffffffffffa0 = in_R8;
      }
    }
    walIndexClose((Wal *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    sqlite3OsClose((sqlite3_file *)0x167446);
    if (uVar2 != 0) {
      sqlite3BeginBenignMalloc();
      sqlite3OsDelete(in_stack_ffffffffffffffa0,
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      sqlite3EndBenignMalloc();
    }
    sqlite3_free((void *)0x167480);
    sqlite3_free((void *)0x16748a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3WalClose(
  Wal *pWal,                      /* Wal to close */
  sqlite3 *db,                    /* For interrupt flag */
  int sync_flags,                 /* Flags to pass to OsSync() (or 0) */
  int nBuf,
  u8 *zBuf                        /* Buffer of at least nBuf bytes */
){
  int rc = SQLITE_OK;
  if( pWal ){
    int isDelete = 0;             /* True to unlink wal and wal-index files */

    assert( walAssertLockmask(pWal) );

    /* If an EXCLUSIVE lock can be obtained on the database file (using the
    ** ordinary, rollback-mode locking methods, this guarantees that the
    ** connection associated with this log file is the only connection to
    ** the database. In this case checkpoint the database and unlink both
    ** the wal and wal-index files.
    **
    ** The EXCLUSIVE lock is not released before returning.
    */
    if( zBuf!=0
     && SQLITE_OK==(rc = sqlite3OsLock(pWal->pDbFd, SQLITE_LOCK_EXCLUSIVE))
    ){
      if( pWal->exclusiveMode==WAL_NORMAL_MODE ){
        pWal->exclusiveMode = WAL_EXCLUSIVE_MODE;
      }
      rc = sqlite3WalCheckpoint(pWal, db,
          SQLITE_CHECKPOINT_PASSIVE, 0, 0, sync_flags, nBuf, zBuf, 0, 0
      );
      if( rc==SQLITE_OK ){
        int bPersist = -1;
        sqlite3OsFileControlHint(
            pWal->pDbFd, SQLITE_FCNTL_PERSIST_WAL, &bPersist
        );
        if( bPersist!=1 ){
          /* Try to delete the WAL file if the checkpoint completed and
          ** fsynced (rc==SQLITE_OK) and if we are not in persistent-wal
          ** mode (!bPersist) */
          isDelete = 1;
        }else if( pWal->mxWalSize>=0 ){
          /* Try to truncate the WAL file to zero bytes if the checkpoint
          ** completed and fsynced (rc==SQLITE_OK) and we are in persistent
          ** WAL mode (bPersist) and if the PRAGMA journal_size_limit is a
          ** non-negative value (pWal->mxWalSize>=0).  Note that we truncate
          ** to zero bytes as truncating to the journal_size_limit might
          ** leave a corrupt WAL file on disk. */
          walLimitSize(pWal, 0);
        }
      }
    }

    walIndexClose(pWal, isDelete);
    sqlite3OsClose(pWal->pWalFd);
    if( isDelete ){
      sqlite3BeginBenignMalloc();
      sqlite3OsDelete(pWal->pVfs, pWal->zWalName, 0);
      sqlite3EndBenignMalloc();
    }
    WALTRACE(("WAL%p: closed\n", pWal));
    sqlite3_free((void *)pWal->apWiData);
    sqlite3_free(pWal);
  }
  return rc;
}